

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

void mcpl_generic_fclose(mcpl_generic_filehandle_t *fh)

{
  if ((FILE *)fh->internal != (FILE *)0x0) {
    if (fh->mode == 0) {
      fclose((FILE *)fh->internal);
    }
    else {
      gzclose();
    }
    fh->internal = (void *)0x0;
    fh->current_pos = 0;
    fh->mode = 0;
    return;
  }
  (*mcpl_error_handler)("Error trying to close invalid file handle");
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

void mcpl_generic_fclose( mcpl_generic_filehandle_t* fh )
{
  if ( !fh->internal )
    mcpl_error("Error trying to close invalid file handle");

  //NB: We only use 1 bit in mode flag for now, so we dont have to actually do
  //"fh->mode & 0x1" to test if it is gzipped.
  if ( fh->mode )
    gzclose((gzFile)(fh->internal));
  else
    fclose( (FILE*)(fh->internal) );

  fh->mode = 0;
  fh->current_pos = 0;
  fh->internal = NULL;
}